

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void andps_VW(PDISASM pMyDisasm)

{
  UInt8 UVar1;
  _Bool _Var2;
  Int32 IVar3;
  bool bVar4;
  
  UVar1 = (pMyDisasm->Reserved_).VEX.state;
  if ((pMyDisasm->Prefix).OperandSize == '\x01') {
    if (UVar1 != '\x01') {
      (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
      (pMyDisasm->Prefix).OperandSize = '\b';
      (pMyDisasm->Reserved_).MemDecoration = 0x70;
      (pMyDisasm->Instruction).Category = 0x40003;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"andpd",6);
LAB_0011a1ca:
      (pMyDisasm->Reserved_).Register_ = 4;
      GxEx(pMyDisasm);
      (pMyDisasm->Operand1).AccessMode = 3;
      return;
    }
    bVar4 = (pMyDisasm->Reserved_).EVEX.state != '\x01';
    IVar3 = 0x110002;
    if (!bVar4) {
      IVar3 = 0x140002;
    }
    (pMyDisasm->Instruction).Category = IVar3;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vandpd",7);
    if (bVar4) goto LAB_0011a11b;
  }
  else {
    if (UVar1 != '\x01') {
      _Var2 = prefixes_present(pMyDisasm);
      if (_Var2) {
        failDecode(pMyDisasm);
        return;
      }
      (pMyDisasm->Reserved_).MemDecoration = 0x6d;
      (pMyDisasm->Instruction).Category = 0x40003;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"andps",6);
      goto LAB_0011a1ca;
    }
    bVar4 = (pMyDisasm->Reserved_).EVEX.state == '\x01';
    IVar3 = 0x110002;
    if (bVar4) {
      IVar3 = 0x140002;
    }
    (pMyDisasm->Instruction).Category = IVar3;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vandps",7);
    if (!bVar4) goto LAB_0011a11b;
  }
  (pMyDisasm->Reserved_).EVEX.tupletype = '\x01';
LAB_0011a11b:
  if ((pMyDisasm->Reserved_).REX.W_ == '\x01') {
    (pMyDisasm->Reserved_).OperandSize = 0x40;
  }
  ArgsVEX(pMyDisasm);
  return;
}

Assistant:

void __bea_callspec__ andps_VW(PDISASM pMyDisasm)
{
   /* ========== 0x66 */
   if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {

     if (GV.VEX.state == InUsePrefix) {
      pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX_INSTRUCTION;
      pMyDisasm->Instruction.Category += ARITHMETIC_INSTRUCTION;
      #ifndef BEA_LIGHT_DISASSEMBLY
      (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vandpd");
      #endif
      if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = FULL;
      if (GV.REX.W_ == 0x1) GV.OperandSize = 64;
      ArgsVEX(pMyDisasm);
     }
     else {
       GV.OperandSize = GV.OriginalOperandSize;
       pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
       GV.MemDecoration = Arg2_m128d_xmm;
       pMyDisasm->Instruction.Category = SSE_INSTRUCTION+LOGICAL_INSTRUCTION;
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "andpd");
       #endif
       GV.Register_ = SSE_REG;
       GxEx(pMyDisasm);
       pMyDisasm->Operand1.AccessMode = READ + WRITE;

     }
   }
   else {
       if (GV.VEX.state == InUsePrefix) {
         pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX_INSTRUCTION;
         pMyDisasm->Instruction.Category += ARITHMETIC_INSTRUCTION;
         #ifndef BEA_LIGHT_DISASSEMBLY
            (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vandps");
         #endif
         if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = FULL;
         if (GV.REX.W_ == 0x1) GV.OperandSize = 64;
         ArgsVEX(pMyDisasm);
       }
       else {
         if (prefixes_present(pMyDisasm)) { failDecode(pMyDisasm); return; }
         GV.MemDecoration = Arg2_m128_xmm;
         pMyDisasm->Instruction.Category = SSE_INSTRUCTION+LOGICAL_INSTRUCTION;
         #ifndef BEA_LIGHT_DISASSEMBLY
            (void) strcpy (pMyDisasm->Instruction.Mnemonic, "andps");
         #endif
         GV.Register_ = SSE_REG;
         GxEx(pMyDisasm);
         pMyDisasm->Operand1.AccessMode = READ + WRITE;

       }
   }
}